

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pic.cpp
# Opt level: O1

int replacePic(istream *in,ostream *output,path *replacementFile)

{
  Type *pTVar1;
  pointer *ppuVar2;
  uint16_t *puVar3;
  undefined8 *puVar4;
  pointer *ppMVar5;
  ushort uVar6;
  undefined8 uVar7;
  pointer pMVar8;
  pointer puVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  undefined2 uVar14;
  uint32_t uVar15;
  pointer pCVar16;
  ostream *stream;
  uint uVar17;
  PicChunk *chunk;
  pointer pPVar18;
  Point PVar19;
  iterator iVar20;
  ulong uVar21;
  size_t sVar22;
  uint uVar23;
  ulong uVar24;
  ChunkData *chunk_1;
  ulong uVar25;
  Size section;
  ulong uVar26;
  pointer pCVar27;
  ulong uVar28;
  pointer pCVar29;
  long lVar30;
  long lVar31;
  Compressor compressor;
  Image replacement;
  PicHeader header;
  unordered_map<Image,_std::pair<unsigned_int,_unsigned_int>,_image_hash,_std::equal_to<Image>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  seen;
  pointer local_1c0;
  pointer local_1b8;
  size_t local_1b0;
  vector<ChunkData,_std::allocator<ChunkData>_> local_1a8;
  ulong local_190;
  Image local_188;
  ulong local_160;
  Compressor local_158;
  Image local_150;
  istream *local_130;
  ostream *local_128;
  pointer local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  pointer local_f8;
  ulong local_f0;
  ulong local_e8;
  PicHeader local_e0;
  ChunkHeader local_b0;
  _Hashtable<Image,_std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Image>,_image_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_e0.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operator>>(in,&local_e0);
  if (local_e0.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_e0.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_160 = 0x400;
    uVar28 = 0x400;
  }
  else {
    uVar17 = 0x400;
    uVar23 = 0x400;
    pPVar18 = local_e0.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      uVar6 = pPVar18->x;
      uVar28 = (ulong)uVar6;
      if (uVar17 < uVar6) {
        uVar28 = (ulong)uVar17;
      }
      if (uVar6 < 0x41) {
        uVar28 = (ulong)uVar17;
      }
      uVar6 = pPVar18->y;
      local_160 = (ulong)uVar6;
      if (uVar23 < uVar6) {
        local_160 = (ulong)uVar23;
      }
      if (uVar6 < 0x41) {
        local_160 = (ulong)uVar23;
      }
      pPVar18 = pPVar18 + 1;
      uVar17 = (uint)uVar28;
      uVar23 = (uint)local_160;
    } while (pPVar18 !=
             local_e0.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  printf("Using %dx%d chunks\n",uVar28);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  Compressor::Compressor(&local_158);
  Image::readPNG(&local_150,replacementFile);
  local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar25 = (long)(local_150.size.width + (int)uVar28 + -1) / (long)(int)uVar28;
  uVar24 = uVar25 & 0xffffffff;
  std::vector<PicChunk,_std::allocator<PicChunk>_>::resize
            (&local_e0.chunks,
             (long)((((int)local_160 + local_150.size.height + -1) / (int)local_160) * (int)uVar25))
  ;
  local_1b0 = PicHeader::binSize(&local_e0);
  local_188.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.size.width = 0;
  local_188.size.height = 0;
  local_188.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_130 = in;
  local_128 = output;
  if (0 < local_150.size.height) {
    lVar31 = 0;
    local_190 = 0;
    uVar25 = local_160;
    uVar24 = (ulong)(uint)local_150.size.height;
    local_100 = uVar28;
    do {
      local_1c0 = local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                  super__Vector_impl_data._M_start;
      if (0 < local_150.size.width) {
        uVar23 = (int)uVar24 - (int)local_190;
        local_e8 = (ulong)uVar23;
        if ((int)uVar25 < (int)uVar23) {
          local_e8 = uVar25 & 0xffffffff;
        }
        local_e8 = local_e8 << 0x20;
        local_f0 = local_190 << 0x20;
        lVar31 = (long)(int)lVar31;
        uVar24 = 0;
        do {
          uVar23 = local_150.size.width - (int)uVar24;
          uVar25 = (ulong)uVar23;
          if ((int)uVar28 < (int)uVar23) {
            uVar25 = uVar28 & 0xffffffff;
          }
          section = (Size)(uVar25 | local_e8);
          local_188.size.height = (int)(local_e8 >> 0x20);
          lVar30 = (long)local_188.size.height;
          local_188.size = section;
          std::vector<Color,_std::allocator<Color>_>::resize
                    (&local_188.colorData,lVar30 * section.width);
          Image::drawOnto(&local_150,&local_188,(Point)0x0,(Point)(uVar24 | local_f0),section);
          PVar19 = shrinkChunk(&local_188);
          pPVar18 = local_e0.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_e0.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
          super__Vector_impl_data._M_start[lVar31].x = (short)PVar19.x + (short)uVar24;
          local_e0.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
          super__Vector_impl_data._M_start[lVar31].y = (short)PVar19.y + (short)local_190;
          iVar20 = std::
                   _Hashtable<Image,_std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Image>,_image_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&local_68,&local_188);
          pCVar16 = local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          pPVar18 = pPVar18 + lVar31;
          if (iVar20.
              super__Node_iterator_base<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            uVar17 = (int)local_1b0 + 0xf;
            uVar23 = (int)local_1b0 + 0x1e;
            if (-1 < (int)uVar17) {
              uVar23 = uVar17;
            }
            uVar25 = (ulong)local_188.size & 0xffff;
            uVar28 = (ulong)local_188.size >> 0x20 & 0xffff;
            local_f8 = pPVar18;
            if (local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              local_120 = local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
              if ((long)local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)local_1c0 == 0x7ffffffffffffff8) {
                local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_start = local_1c0;
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              lVar30 = (long)local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)local_1c0 >> 3;
              uVar26 = lVar30 * 0x4ec4ec4ec4ec4ec5;
              uVar21 = uVar26;
              if (local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                  super__Vector_impl_data._M_finish == local_1c0) {
                uVar21 = 1;
              }
              local_118 = uVar21 + uVar26;
              if (0x13b13b13b13b13a < local_118) {
                local_118 = 0x13b13b13b13b13b;
              }
              if (CARRY8(uVar21,uVar26)) {
                local_118 = 0x13b13b13b13b13b;
              }
              local_110 = uVar28;
              local_108 = uVar25;
              if (local_118 == 0) {
                local_1b8 = (pointer)0x0;
              }
              else {
                local_1b8 = (pointer)operator_new(local_118 * 0x68);
              }
              ppuVar2 = &(local_1b8->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish + lVar30;
              *ppuVar2 = (pointer)0x0;
              ppuVar2[1] = (pointer)0x0;
              puVar3 = &(local_1b8->header).h + lVar30 * 4;
              *(undefined8 *)puVar3 = 0;
              *(undefined8 *)(puVar3 + 4) = 0;
              puVar4 = &(local_1b8->header).transparentMasks.
                        super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + lVar30;
              *puVar4 = 0;
              puVar4[1] = 0;
              ppMVar5 = &(local_1b8->header).transparentMasks.
                         super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar30;
              *ppMVar5 = (pointer)0x0;
              ppMVar5[1] = (pointer)0x0;
              puVar4 = &(local_1b8->header).masks.
                        super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                        super__Vector_impl_data._M_finish + lVar30;
              *puVar4 = 0;
              puVar4[1] = 0;
              pTVar1 = &(local_1b8->header).type + lVar30 * 4;
              *(undefined8 *)pTVar1 = 0;
              (((vector<MaskRect,_std::allocator<MaskRect>_> *)(pTVar1 + 4))->
              super__Vector_base<MaskRect,_std::allocator<MaskRect>_>)._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              *(undefined8 *)(&local_1b8->offset + lVar30 * 2) = 0;
              pCVar27 = local_1b8;
              for (pCVar29 = local_1c0; pCVar16 != pCVar29; pCVar29 = pCVar29 + 1) {
                (pCVar27->header).type = (pCVar29->header).type;
                pMVar8 = (pCVar29->header).masks.
                         super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                (pCVar27->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pCVar29->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                (pCVar27->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                _M_impl.super__Vector_impl_data._M_finish = pMVar8;
                (pCVar27->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pCVar29->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                (pCVar29->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                (pCVar29->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (pCVar29->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                pMVar8 = (pCVar29->header).transparentMasks.
                         super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                (pCVar27->header).transparentMasks.
                super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pCVar29->header).transparentMasks.
                     super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                     super__Vector_impl_data._M_start;
                (pCVar27->header).transparentMasks.
                super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                super__Vector_impl_data._M_finish = pMVar8;
                (pCVar27->header).transparentMasks.
                super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pCVar29->header).transparentMasks.
                     super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                (pCVar29->header).transparentMasks.
                super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                (pCVar29->header).transparentMasks.
                super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                (pCVar29->header).transparentMasks.
                super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                uVar10 = (pCVar29->header).x;
                uVar11 = (pCVar29->header).y;
                uVar12 = (pCVar29->header).w;
                uVar13 = (pCVar29->header).h;
                uVar14 = *(undefined2 *)&(pCVar29->header).field_0x42;
                uVar15 = (pCVar29->header).size;
                (pCVar27->header).alignmentWords = (pCVar29->header).alignmentWords;
                (pCVar27->header).x = uVar10;
                (pCVar27->header).y = uVar11;
                (pCVar27->header).w = uVar12;
                (pCVar27->header).h = uVar13;
                *(undefined2 *)&(pCVar27->header).field_0x42 = uVar14;
                (pCVar27->header).size = uVar15;
                puVar9 = (pCVar29->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                (pCVar27->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pCVar29->data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
                (pCVar27->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish = puVar9;
                (pCVar27->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pCVar29->data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                (pCVar29->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                (pCVar29->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (pCVar29->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                pCVar27->offset = pCVar29->offset;
                pMVar8 = (pCVar29->header).transparentMasks.
                         super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (pMVar8 != (pointer)0x0) {
                  operator_delete(pMVar8,(long)(pCVar29->header).transparentMasks.
                                               super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)pMVar8);
                }
                pMVar8 = (pCVar29->header).masks.
                         super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (pMVar8 != (pointer)0x0) {
                  operator_delete(pMVar8,(long)(pCVar29->header).masks.
                                               super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)pMVar8);
                }
                pCVar27 = pCVar27 + 1;
              }
              if (local_1c0 != (pointer)0x0) {
                operator_delete(local_1c0,(long)local_120 - (long)local_1c0);
              }
              local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = local_1b8 + local_118;
              uVar28 = local_110;
              uVar25 = local_108;
            }
            else {
              ((local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_finish)->data).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              ((local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_finish)->data).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              ((local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_finish)->header).h = 0;
              *(undefined2 *)
               &((local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                  super__Vector_impl_data._M_finish)->header).field_0x42 = 0;
              ((local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_finish)->header).size = 0;
              ((local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_finish)->data).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              ((local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_finish)->header).transparentMasks.
              super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              ((local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_finish)->header).alignmentWords = 0;
              ((local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_finish)->header).x = 0;
              ((local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_finish)->header).y = 0;
              ((local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_finish)->header).w = 0;
              ((local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_finish)->header).transparentMasks.
              super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              ((local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_finish)->header).transparentMasks.
              super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              ((local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_finish)->header).masks.
              super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              ((local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_finish)->header).masks.
              super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              *(undefined8 *)
               &(local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                 super__Vector_impl_data._M_finish)->header = 0;
              ((local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_finish)->header).masks.
              super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              *(undefined8 *)
               &(local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                 super__Vector_impl_data._M_finish)->offset = 0;
              local_1b8 = local_1c0;
              pCVar27 = local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
            super__Vector_impl_data._M_finish = pCVar27 + 1;
            Compressor::encodeChunk
                      (&local_b0,&local_158,&pCVar27->data,&local_188,
                       (MaskRect)(uVar25 << 0x20 | uVar28 << 0x30),(Point)0x0,local_e0.isSwitch);
            (pCVar27->header).type = local_b0.type;
            std::vector<MaskRect,_std::allocator<MaskRect>_>::_M_move_assign
                      (&(pCVar27->header).masks,(Size *)&local_b0.masks);
            std::vector<MaskRect,_std::allocator<MaskRect>_>::_M_move_assign
                      (&(pCVar27->header).transparentMasks,(Size *)&local_b0.transparentMasks);
            (pCVar27->header).alignmentWords = local_b0.alignmentWords;
            (pCVar27->header).x = local_b0.x;
            (pCVar27->header).y = local_b0.y;
            (pCVar27->header).w = local_b0.w;
            (pCVar27->header).h = local_b0.h;
            *(undefined2 *)&(pCVar27->header).field_0x42 = local_b0._66_2_;
            (pCVar27->header).size = local_b0.size;
            if (local_b0.transparentMasks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0.transparentMasks.
                              super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_b0.transparentMasks.
                                    super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_b0.transparentMasks.
                                    super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if (local_b0.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_b0.masks.
                                    super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_b0.masks.
                                    super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            pPVar18 = local_f8;
            uVar23 = uVar23 & 0xfffffff0;
            pCVar27->offset = uVar23;
            local_f8->offset = uVar23;
            sVar22 = ChunkHeader::calcAlignmentGetBinSize(&pCVar27->header);
            pPVar18->size =
                 ((int)sVar22 +
                 *(int *)&(pCVar27->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish) -
                 *(int *)&(pCVar27->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
            local_b0.transparentMasks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
            _M_impl.super__Vector_impl_data._M_start = *(pointer *)&pPVar18->offset;
            local_b0._0_8_ = local_188.size;
            local_b0.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)local_188.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            local_b0.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)local_188.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
            local_b0.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)local_188.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_188.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_188.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_188.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            _Hashtable<Image,std::pair<Image_const,std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<Image_const,std::pair<unsigned_int,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<Image>,image_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<Image,std::pair<unsigned_int,unsigned_int>>>
                      ((_Hashtable<Image,std::pair<Image_const,std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<Image_const,std::pair<unsigned_int,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<Image>,image_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&local_68,(Size *)&local_b0);
            if (local_b0.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_b0.masks.
                                    super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_b0.masks.
                                    super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            local_1b0 = (size_t)(uVar23 + pPVar18->size);
            local_1c0 = local_1b8;
            uVar28 = local_100;
          }
          else {
            uVar7 = *(undefined8 *)
                     ((long)iVar20.
                            super__Node_iterator_base<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_true>
                            ._M_cur + 0x28);
            pPVar18->offset = (int)uVar7;
            pPVar18->size = (int)((ulong)uVar7 >> 0x20);
          }
          lVar31 = lVar31 + 1;
          uVar23 = (int)uVar24 + (int)uVar28;
          uVar24 = (ulong)uVar23;
          uVar25 = local_160;
        } while ((int)uVar23 < local_150.size.width);
      }
      local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
      super__Vector_impl_data._M_start = local_1c0;
      uVar23 = (int)local_190 + (int)uVar25;
      local_190 = (ulong)uVar23;
      uVar24 = (ulong)(uint)local_150.size.height;
    } while ((int)uVar23 < local_150.size.height);
  }
  stream = local_128;
  local_e0.filesize = (uint32_t)local_1b0;
  PicHeader::write(&local_e0,(int)local_128,local_130,uVar24);
  pCVar16 = local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (pCVar27 = local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                 super__Vector_impl_data._M_start; pCVar27 != pCVar16; pCVar27 = pCVar27 + 1) {
    std::ostream::seekp((long)stream,pCVar27->offset);
    operator<<(stream,&pCVar27->header);
    std::ostream::write((char *)stream,
                        (long)(pCVar27->data).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_188.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<ChunkData,_std::allocator<ChunkData>_>::~vector(&local_1a8);
  if (local_150.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Compressor::~Compressor(&local_158);
  std::
  _Hashtable<Image,_std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Image>,_image_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  if (local_e0.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int replacePic(std::istream &in, std::ostream &output, const fs::path &replacementFile) {
	PicHeader header;
	in >> header;

	int CHUNK_WIDTH = 1024;
	int CHUNK_HEIGHT = 1024;

	for (const auto& chunk : header.chunks) {
		if (chunk.x > 64 && chunk.x < CHUNK_WIDTH) {
			CHUNK_WIDTH = chunk.x;
		}
		if (chunk.y > 64 && chunk.y < CHUNK_HEIGHT) {
			CHUNK_HEIGHT = chunk.y;
		}
	}

	printf("Using %dx%d chunks\n", CHUNK_WIDTH, CHUNK_HEIGHT);

	std::unordered_map<Image, std::pair<uint32_t, uint32_t>, image_hash> seen;

	Compressor compressor;
	Image replacement = Image::readPNG(replacementFile);
	struct ChunkData {
		ChunkHeader header;
		std::vector<uint8_t> data;
		uint32_t offset;
	};
	std::vector<ChunkData> data;
	std::vector<PicChunk> chunkEntries;
	Size sizeInChunks = {(replacement.size.width + CHUNK_WIDTH - 1) / CHUNK_WIDTH, (replacement.size.height + CHUNK_HEIGHT - 1) / CHUNK_HEIGHT};
	header.chunks.resize(sizeInChunks.area());
	int pos = header.binSize();
	Image chunk;
	int headerIdx = 0;
	for (int y1 = 0; y1 < replacement.size.height; y1 += CHUNK_HEIGHT) {
		int height = std::min(replacement.size.height - y1, CHUNK_HEIGHT);
		for (int x1 = 0; x1 < replacement.size.width; x1 += CHUNK_WIDTH) {
			int width = std::min(replacement.size.width - x1, CHUNK_WIDTH);
			chunk.fastResize({width, height});
			replacement.drawOnto(chunk, {0, 0}, {x1, y1}, {width, height});
			Point shrink = shrinkChunk(chunk);

			auto& headerEntry = header.chunks[headerIdx];
			headerIdx++;
			headerEntry.x = x1 + shrink.x;
			headerEntry.y = y1 + shrink.y;

			auto found = seen.find(chunk);
			if (found == seen.end()) {
				pos = (pos + 15) / 16 * 16;
				MaskRect bounds = {0, 0, static_cast<uint16_t>(chunk.size.width), static_cast<uint16_t>(chunk.size.height)};
				data.emplace_back();
				auto& chunkEntry = data.back();
				chunkEntry.header = compressor.encodeChunk(chunkEntry.data, chunk, bounds, {0, 0}, header.isSwitch);
				chunkEntry.offset = pos;

				headerEntry.offset = pos;
				headerEntry.size = chunkEntry.header.calcAlignmentGetBinSize() + chunkEntry.data.size();
				seen.insert(std::make_pair(std::move(chunk), std::make_pair(headerEntry.offset, headerEntry.size)));
				pos += headerEntry.size;
			} else {
				headerEntry.offset = found->second.first;
				headerEntry.size = found->second.second;
			}
		}
	}

	header.filesize = pos;
	header.write(output, in);
	for (auto& chunk : data) {
		output.seekp(chunk.offset, output.beg);
		output << chunk.header;
		output.write(reinterpret_cast<char*>(chunk.data.data()), chunk.data.size());
	}
	return 0;
}